

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O2

void do_send_receive(node_info *my_info,int tile_held,IceTInt num_tiles,
                    IceTBoolean *all_contained_tmasks,IceTImage image,IceTVoid *inSparseImageBuffer,
                    IceTSizeType inSparseImageBufferSize,IceTSparseImage outSparseImage)

{
  int iVar1;
  IceTSparseImage compressed_image;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  IceTBoolean *local_38;
  
  iVar1 = my_info->tile_sending;
  if (iVar1 != -1) {
    local_38 = all_contained_tmasks;
    if (iVar1 == tile_held) {
      icetCompressImage(image,outSparseImage);
      tile_held = -1;
    }
    else {
      icetGetCompressedTileImage(iVar1,outSparseImage);
    }
    icetSparseImagePackageForSend(outSparseImage,&package_buffer,&package_size);
    all_contained_tmasks = local_38;
  }
  iVar1 = my_info->tile_receiving;
  if (iVar1 == -1) {
    if (my_info->tile_sending != -1) {
      icetCommSend(package_buffer,package_size,0x8001,my_info->send_dest,0x28);
    }
  }
  else {
    if ((tile_held != iVar1) && (all_contained_tmasks[num_tiles * my_info->rank + iVar1] != '\0')) {
      icetGetTileImage(iVar1,image);
      tile_held = my_info->tile_receiving;
    }
    if (my_info->tile_sending == -1) {
      icetCommRecv(inSparseImageBuffer,inSparseImageBufferSize,0x8001,my_info->recv_src,0x28);
    }
    else {
      icetCommSendrecv(package_buffer,package_size,0x8001,my_info->send_dest,0x28,
                       inSparseImageBuffer,inSparseImageBufferSize,0x8001,my_info->recv_src,0x28);
    }
    compressed_image = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
    if (tile_held == my_info->tile_receiving) {
      icetCompressedComposite(image,compressed_image,1);
    }
    else {
      icetDecompressImage(compressed_image,image);
    }
  }
  return;
}

Assistant:

static void do_send_receive(const struct node_info *my_info, int tile_held,
                            IceTInt num_tiles,
                            IceTBoolean *all_contained_tmasks,
                            IceTImage image,
                            IceTVoid *inSparseImageBuffer,
                            IceTSizeType inSparseImageBufferSize,
                            IceTSparseImage outSparseImage)
{
    IceTSparseImage inSparseImage;
    IceTVoid *package_buffer;
    IceTSizeType package_size;

    if (my_info->tile_sending != -1) {
        icetRaiseDebug2("Sending tile %d to node %d.", my_info->tile_sending,
                        my_info->send_dest);
        if (tile_held == my_info->tile_sending) {
            icetCompressImage(image, outSparseImage);
            tile_held = -1;
        } else {
            icetGetCompressedTileImage(my_info->tile_sending,
                                       outSparseImage);
        }
        icetSparseImagePackageForSend(outSparseImage,
                                      &package_buffer, &package_size);
    }

    if (my_info->tile_receiving != -1) {
        icetRaiseDebug2("Receiving tile %d from node %d.",
                        my_info->tile_receiving, my_info->recv_src);
        if (   (tile_held != my_info->tile_receiving)
            && all_contained_tmasks[my_info->rank*num_tiles
                                   +my_info->tile_receiving])
        {
            icetGetTileImage(my_info->tile_receiving, image);
            tile_held = my_info->tile_receiving;
        }

        if (my_info->tile_sending != -1) {
            icetCommSendrecv(package_buffer, package_size, ICET_BYTE,
                             my_info->send_dest, VTREE_IMAGE_DATA,
                             inSparseImageBuffer, inSparseImageBufferSize,
                             ICET_BYTE, my_info->recv_src, VTREE_IMAGE_DATA);
        } else {
            icetCommRecv(inSparseImageBuffer, inSparseImageBufferSize,
                         ICET_BYTE, my_info->recv_src, VTREE_IMAGE_DATA);
        }
        inSparseImage =icetSparseImageUnpackageFromReceive(inSparseImageBuffer);

        if (tile_held == my_info->tile_receiving) {
            icetCompressedComposite(image, inSparseImage, 1);
        } else {
            icetDecompressImage(inSparseImage, image);
        }

    } else if (my_info->tile_sending != -1) {
        icetCommSend(package_buffer, package_size, ICET_BYTE,
                     my_info->send_dest, VTREE_IMAGE_DATA);
    }
}